

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

shared_array<int> * __thiscall
FIX::shared_array<int>::operator=(shared_array<int> *this,shared_array<int> *rhs)

{
  shared_array<int> *rhs_local;
  shared_array<int> *this_local;
  
  if (rhs != this) {
    attach(rhs);
    release(this);
    this->m_size = rhs->m_size;
    this->m_buffer = rhs->m_buffer;
  }
  return this;
}

Assistant:

shared_array& operator=(const shared_array& rhs)
    {
      if( &rhs == this )
        return *this;

      rhs.attach();
      release();

      m_size = rhs.m_size;
      m_buffer = rhs.m_buffer;

      return *this;
    }